

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O1

optional<slang::ConstantRange>
slang::ConstantRange::getIndexedRange(int32_t l,int32_t r,bool littleEndian,bool indexedUp)

{
  uint uVar1;
  _Storage<slang::ConstantRange,_true> _Var2;
  uint uVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  optional<slang::ConstantRange> oVar7;
  optional<slang::ConstantRange> oVar8;
  
  oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload =
       CONCAT71(in_register_00000011,littleEndian) & 0xffffffff;
  iVar4 = r + -1;
  if ((int)CONCAT71(in_register_00000009,indexedUp) == 0) {
    uVar3 = l - iVar4;
    uVar1 = l;
    if (SBORROW4(l,iVar4)) {
      uVar3 = 0;
      uVar1 = 0;
    }
    uVar5 = (ulong)uVar1;
    uVar6 = (ulong)uVar3;
    if (SBORROW4(l,iVar4)) goto LAB_0027b1a2;
  }
  else {
    uVar5 = (ulong)(uint)(iVar4 + l);
    if (SCARRY4(iVar4,l)) {
      uVar5 = 0;
    }
    uVar6 = (ulong)(uint)l;
    if (SCARRY4(iVar4,l)) {
LAB_0027b1a2:
      oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._8_4_ = 0;
      return (optional<slang::ConstantRange>)
             oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ConstantRange>;
    }
  }
  if ((char)oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_payload == '\0') {
    _Var2 = (_Storage<slang::ConstantRange,_true>)(uVar6 | uVar5 << 0x20);
  }
  else {
    _Var2 = (_Storage<slang::ConstantRange,_true>)(uVar5 | uVar6 << 0x20);
  }
  oVar8.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._8_4_ = 1;
  oVar8.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload = _Var2;
  return (optional<slang::ConstantRange>)
         oVar8.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>;
}

Assistant:

std::optional<ConstantRange> ConstantRange::getIndexedRange(int32_t l, int32_t r, bool littleEndian,
                                                            bool indexedUp) {
    ConstantRange result;
    int32_t count = r - 1;
    if (indexedUp) {
        auto upper = checkedAddS32(l, count);
        if (!upper)
            return std::nullopt;

        result.left = *upper;
        result.right = l;
    }
    else {
        auto lower = checkedSubS32(l, count);
        if (!lower)
            return std::nullopt;

        result.left = l;
        result.right = *lower;
    }

    if (!littleEndian)
        return result.reverse();

    return result;
}